

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O1

void bench_sha256(void *arg,int iters)

{
  secp256k1_sha256 sha;
  secp256k1_sha256 local_88;
  
  if (0 < iters) {
    do {
      local_88.s[0] = 0x6a09e667;
      local_88.s[1] = 0xbb67ae85;
      local_88.s[2] = 0x3c6ef372;
      local_88.s[3] = 0xa54ff53a;
      local_88.s[4] = 0x510e527f;
      local_88.s[5] = 0x9b05688c;
      local_88.s[6] = 0x1f83d9ab;
      local_88.s[7] = 0x5be0cd19;
      local_88.bytes = 0;
      secp256k1_sha256_write(&local_88,(uchar *)((long)arg + 0x290),0x20);
      secp256k1_sha256_finalize(&local_88,(uchar *)((long)arg + 0x290));
      iters = iters + -1;
    } while (iters != 0);
  }
  return;
}

Assistant:

static void bench_sha256(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;
    secp256k1_sha256 sha;

    for (i = 0; i < iters; i++) {
        secp256k1_sha256_initialize(&sha);
        secp256k1_sha256_write(&sha, data->data, 32);
        secp256k1_sha256_finalize(&sha, data->data);
    }
}